

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExpectedNan(WastParser *this,ExpectedNan *expected)

{
  ExpectedNan EVar1;
  TokenType TVar2;
  Token TStack_58;
  
  TVar2 = Peek(this,0);
  if (TVar2 == NanArithmetic) {
    EVar1 = Arithmetic;
  }
  else {
    if (TVar2 != NanCanonical) {
      return (Result)Error;
    }
    EVar1 = Canonical;
  }
  *expected = EVar1;
  Consume(&TStack_58,this);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseExpectedNan(ExpectedNan* expected) {
  WABT_TRACE(ParseExpectedNan);
  TokenType token_type = Peek();
  switch (token_type) {
    case TokenType::NanArithmetic:
      *expected = ExpectedNan::Arithmetic;
      break;
    case TokenType::NanCanonical:
      *expected = ExpectedNan::Canonical;
      break;
    default:
      return Result::Error;
  }
  Consume();
  return Result::Ok;
}